

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_compress.c
# Opt level: O2

int output_bit_array(bit_array_t *bit_array,byte_t *output_buffer,FILE *output_file_ptr)

{
  uint bit_pos;
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  for (uVar3 = (ulong)bit_array->length; 0 < (long)uVar3; uVar3 = uVar3 - 1) {
    lVar2 = bit_idx_to_byte_idx((long)out_bit_idx);
    bit_pos = bit_pos_in_current_byte((long)out_bit_idx);
    if (bit_array->buffer[uVar3 - 1] == '1') {
      bit_set_one(output_buffer + lVar2,bit_pos);
    }
    else {
      bit_set_zero(output_buffer + lVar2,bit_pos);
    }
    iVar1 = out_bit_idx + 1;
    if (out_bit_idx + 1 == 0x2000) {
      iVar1 = flush_data(output_buffer,output_file_ptr);
      if (iVar1 != 0) break;
      out_bit_idx = 0;
      memset(output_buffer,0,0x400);
      iVar1 = out_bit_idx;
    }
    out_bit_idx = iVar1;
  }
  return (int)(0 < (long)uVar3);
}

Assistant:

int output_bit_array(const bit_array_t* bit_array, byte_t *output_buffer, FILE* output_file_ptr) {
    for(int i = bit_array->length-1; i>=0; i--) {
        // calculate the current position (in byte) of the output_buffer
        long buffer_byte_idx = bit_idx_to_byte_idx(out_bit_idx);

        // calculate which bit to change in the byte 11100000
        int bit_pos = bit_pos_in_current_byte(out_bit_idx);

        if(bit_array->buffer[i] == BIT_1)
            bit_set_one(&output_buffer[buffer_byte_idx], bit_pos);
        else
            bit_set_zero(&output_buffer[buffer_byte_idx], bit_pos);

        // buffer full, flush data to file
        if(out_bit_idx+1 == BUFFER_SIZE * SYMBOL_BITS) {
            int rc = flush_data(output_buffer, output_file_ptr);
            if(rc != RC_OK)
                return rc;

            // reset buffer index
            out_bit_idx = 0;
            memset(output_buffer, 0, BUFFER_SIZE);
        } else {
            out_bit_idx++;
        }
    }

    return RC_OK;
}